

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

void Gia_Iso2ManPrint(Gia_Iso2Man_t *p,abctime Time,int fVerbose)

{
  uint uVar1;
  int fVerbose_local;
  abctime Time_local;
  Gia_Iso2Man_t *p_local;
  
  if (fVerbose != 0) {
    p->nIters = p->nIters + 1;
    printf("Iter %4d :  ");
    uVar1 = Vec_IntSize(p->vTied);
    printf("Entries =%8d.  ",(ulong)uVar1);
    printf("Uniques =%8d.  ",(ulong)(uint)p->nUniques);
    uVar1 = Vec_PtrSize(p->vSingles);
    printf("Singles =%8d.  ",(ulong)uVar1);
    printf("%9.2f sec",(double)((float)Time / 1e+06));
    printf("\n");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Gia_Iso2ManPrint( Gia_Iso2Man_t * p, abctime Time, int fVerbose )
{
    if ( !fVerbose )
        return;
    printf( "Iter %4d :  ", p->nIters++ );
    printf( "Entries =%8d.  ", Vec_IntSize(p->vTied) );
    printf( "Uniques =%8d.  ", p->nUniques );
    printf( "Singles =%8d.  ", Vec_PtrSize(p->vSingles) );
    printf( "%9.2f sec", (float)(Time)/(float)(CLOCKS_PER_SEC) );
    printf( "\n" );
    fflush( stdout );
}